

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iStart;
  int iVar1;
  ExprList *pList;
  Vdbe *p;
  int iVar2;
  int iVar3;
  KeyInfo *pKVar4;
  int target;
  int p1;
  int iVar5;
  int iVar6;
  int p1_00;
  int p1_01;
  int nBase;
  char cVar7;
  uint uVar8;
  Op *pOVar9;
  Op *pOVar10;
  uint uVar11;
  int local_60;
  
  uVar8 = pSort->sortFlags & 1;
  uVar11 = uVar8 ^ 1;
  pList = pSort->pOrderBy;
  iVar3 = pList->nExpr;
  nBase = uVar11 + nData + iVar3;
  iStart = pSort->nOBSat;
  if (nPrefixReg == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + nBase;
  }
  else {
    target = regData - nPrefixReg;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  p = pParse->pVdbe;
  iVar5 = pParse->nLabel + -1;
  pParse->nLabel = iVar5;
  pSort->labelDone = iVar5;
  sqlite3ExprCodeExprList(pParse,pList,target,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar7 = (char)uVar8;
  if (cVar7 == '\0') {
    sqlite3VdbeAddOp3(p,0x7e,pSort->iECursor,iVar3 + target,0);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4f,regData,uVar11 + iVar3 + target,nData);
  }
  local_60 = 0;
  iVar5 = 0;
  if (0 < iStart) {
    iVar5 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
    iVar1 = pSort->nOBSat;
    p1_01 = pParse->nMem + 1;
    pParse->nMem = iVar1 + pParse->nMem;
    if (cVar7 == '\0') {
      iVar2 = target + iVar3;
      iVar6 = 0x11;
    }
    else {
      iVar2 = pSort->iECursor;
      iVar6 = 0x78;
    }
    iVar2 = sqlite3VdbeAddOp3(p,iVar6,iVar2,0,0);
    sqlite3VdbeAddOp3(p,0x5a,p1_01,target,pSort->nOBSat);
    if (p->db->mallocFailed == '\0') {
      pOVar9 = p->aOp + pSort->addrSortIndex;
    }
    else {
      pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pOVar9->p2 = nBase - iVar1;
    pKVar4 = (pOVar9->p4).pKeyInfo;
    memset(pKVar4->aSortFlags,0,(ulong)pKVar4->nKeyField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar4,-8);
    pKVar4 = sqlite3KeyInfoFromExprList
                       (pParse,pSort->pOrderBy,iStart,
                        ~(uint)pKVar4->nKeyField + (uint)pKVar4->nAllField);
    (pOVar9->p4).pKeyInfo = pKVar4;
    iVar1 = p->nOp;
    iVar6 = iVar1 + 1;
    sqlite3VdbeAddOp3(p,0xe,iVar6,0,iVar6);
    iVar6 = pParse->nLabel + -1;
    pParse->nLabel = iVar6;
    pSort->labelBkOut = iVar6;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp3(p,10,p1_00,iVar6,0);
    sqlite3VdbeAddOp3(p,0x92,pSort->iECursor,0,0);
    if (p1 != 0) {
      sqlite3VdbeAddOp3(p,0x11,p1,pSort->labelDone,0);
    }
    pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      pOVar9 = p->aOp + iVar2;
    }
    pOVar9->p2 = p->nOp;
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4f,target,p1_01,pSort->nOBSat);
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + iVar1;
    }
    pOVar10->p2 = p->nOp;
  }
  if (p1 != 0) {
    iVar1 = pSort->iECursor;
    sqlite3VdbeAddOp3(p,0x3c,p1,p->nOp + 4,0);
    sqlite3VdbeAddOp3(p,0x20,iVar1,0,0);
    local_60 = sqlite3VdbeAddOp4Int(p,0x28,iVar1,0,target + iStart,iVar3 - iStart);
    sqlite3VdbeAddOp3(p,0x82,iVar1,0,0);
  }
  if (iVar5 == 0) {
    iVar5 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
  }
  sqlite3VdbeAddOp4Int
            (p,pSort->sortFlags & 1 | 0x8a,pSort->iECursor,iVar5,target + iStart,nBase - iStart);
  if (local_60 != 0) {
    iVar3 = pSort->labelOBLopt;
    if (iVar3 == 0) {
      iVar3 = p->nOp;
    }
    if (p->db->mallocFailed == '\0') {
      pOVar9 = p->aOp + local_60;
    }
    else {
      pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar9->p2 = iVar3;
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCES optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the
  **       SortCtx.pDeferredRowLoad optimization.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPush = sqlite3VdbeCurrentAddr(v);
#endif

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr);
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortFlags, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    pOp = 0; /* Ensure pOp not used after sqlite3VdbeAddOp3() */
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPushEnd = sqlite3VdbeCurrentAddr(v)-1;
#endif
}